

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

size_type __thiscall boost::filesystem::path::m_append_separator_if_needed(path *this)

{
  bool bVar1;
  uint uVar2;
  reference pcVar3;
  path *ppVar4;
  byte local_31;
  size_type tmp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  path *local_18;
  path *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  local_31 = 0;
  if ((uVar2 & 1) == 0) {
    tmp = std::__cxx11::string::end();
    local_20 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&tmp,1);
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    bVar1 = anon_unknown.dwarf_f716::is_separator(*pcVar3);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) == 0) {
    this_local = (path *)0x0;
  }
  else {
    ppVar4 = (path *)std::__cxx11::string::size();
    std::__cxx11::string::operator+=((string *)this,'/');
    this_local = ppVar4;
  }
  return (size_type)this_local;
}

Assistant:

path::string_type::size_type path::m_append_separator_if_needed()
  {
    if (!m_pathname.empty() &&
#     ifdef BOOST_WINDOWS_API
      *(m_pathname.end()-1) != colon && 
#     endif
      !is_separator(*(m_pathname.end()-1)))
    {
      string_type::size_type tmp(m_pathname.size());
      m_pathname += preferred_separator;
      return tmp;
    }
    return 0;
  }